

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
GEO::FileSystem::MemoryNode::get_directory_entries
          (MemoryNode *this,string *path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  MemoryNode *pMVar5;
  undefined1 uVar6;
  string rest;
  string subdir;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
  it;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
  local_58;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  split_path(path,&local_98,&local_b8);
  bVar1 = std::operator==(&local_98,"");
  if (bVar1) {
    bVar1 = std::operator==(&local_b8,"");
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(result);
      for (p_Var3 = (this->subnodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(this->subnodes_)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
        ::pair(&local_58,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
                *)(p_Var3 + 1));
        std::operator+(&local_78,&this->path_,&local_58.first);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                   &local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
        ::~pair(&local_58);
      }
      for (p_Var3 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(this->files_)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                *)&local_58,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                *)(p_Var3 + 1));
        std::operator+(&local_78,&this->path_,&local_58.first);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                   &local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_58);
      }
      uVar6 = 1;
      goto LAB_00149730;
    }
  }
  bVar1 = std::operator==(&local_98,"");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&local_98);
    std::__cxx11::string::assign((char *)&local_b8);
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
          ::find(&(this->subnodes_)._M_t,&local_98);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->subnodes_)._M_t._M_impl.super__Rb_tree_header) {
    uVar6 = 0;
  }
  else {
    pMVar5 = SmartPointer<GEO::FileSystem::MemoryNode>::operator->
                       ((SmartPointer<GEO::FileSystem::MemoryNode> *)(iVar4._M_node + 2));
    iVar2 = (*(pMVar5->super_Node).super_Counted._vptr_Counted[7])(pMVar5,&local_b8,result);
    uVar6 = (undefined1)iVar2;
  }
LAB_00149730:
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  return (bool)uVar6;
}

Assistant:

bool MemoryNode::get_directory_entries(
	    const std::string& path, std::vector<std::string>& result
	) {
	    std::string subdir;
	    std::string rest;
	    split_path(path, subdir, rest);
	    if(subdir == "" && rest == "") {
		result.clear();
		for(auto it : subnodes_) {
		    result.push_back(path_ + it.first);
		}
		for(auto it : files_) {
		    result.push_back(path_ + it.first);
		}
		return true;
	    } else {
		if(subdir == "") {
		    subdir = rest;
		    rest = "";
		}
		auto it = subnodes_.find(subdir);
		if(it == subnodes_.end()) {
		    return false;
		}
		return it->second->get_directory_entries(rest, result);
	    }
	}